

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::Stack<Shell::Options::AbstractOptionValue_*>::Stack
          (Stack<Shell::Options::AbstractOptionValue_*> *this,
          Stack<Shell::Options::AbstractOptionValue_*> *s)

{
  BottomFirstIterator it;
  Stack<Shell::Options::AbstractOptionValue_*> *in_RSI;
  size_t *in_RDI;
  void *mem;
  Stack<Shell::Options::AbstractOptionValue_*> *in_stack_ffffffffffffffc8;
  AbstractOptionValue **in_stack_ffffffffffffffd8;
  BottomFirstIterator local_18;
  
  *in_RDI = in_RSI->_capacity;
  if (*in_RDI == 0) {
    in_RDI[1] = 0;
  }
  else {
    in_stack_ffffffffffffffd8 =
         (AbstractOptionValue **)Lib::alloc((size_t)in_stack_ffffffffffffffc8);
    in_RDI[1] = (size_t)in_stack_ffffffffffffffd8;
  }
  in_RDI[2] = in_RDI[1];
  in_RDI[3] = in_RDI[1] + *in_RDI * 8;
  BottomFirstIterator::BottomFirstIterator(&local_18,in_RSI);
  it._afterLast = in_stack_ffffffffffffffd8;
  it._pointer = (AbstractOptionValue **)in_RSI;
  Stack<Shell::Options::AbstractOptionValue*>::
  loadFromIterator<Lib::Stack<Shell::Options::AbstractOptionValue*>::BottomFirstIterator>
            (in_stack_ffffffffffffffc8,it);
  return;
}

Assistant:

Stack(const Stack& s)
   : _capacity(s._capacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = 0;
    }
    _cursor = _stack;
    _end = _stack+_capacity;

    loadFromIterator(BottomFirstIterator(const_cast<Stack&>(s)));
  }